

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStream_GetAvailableFrames
                  (PaAlsaStream *self,int queryCapture,int queryPlayback,unsigned_long *available,
                  int *xrunOccurred)

{
  ulong *in_RCX;
  int in_EDX;
  int in_ESI;
  PaAlsaStreamComponent *in_R8;
  unsigned_long playbackFrames;
  unsigned_long captureFrames;
  PaError result;
  int *local_40;
  int *local_38;
  int *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  PaError PVar1;
  
  PVar1 = 0;
  *(undefined4 *)&in_R8->hostSampleFormat = 0;
  local_40 = in_stack_ffffffffffffffd0;
  if (in_ESI != 0) {
    paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                           (in_R8,(unsigned_long *)(ulong)in_stack_ffffffffffffffd8,
                            in_stack_ffffffffffffffd0);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &self->capture, &captureFrames, xrunOccurred )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3708\n"
                       );
      return paUtilErr_;
    }
    local_40 = in_stack_ffffffffffffffd0;
    if ((int)in_R8->hostSampleFormat != 0) {
      return PVar1;
    }
  }
  if (in_EDX != 0) {
    paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                           (in_R8,(unsigned_long *)CONCAT44(PVar1,in_stack_ffffffffffffffd8),
                            local_40);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &self->playback, &playbackFrames, xrunOccurred )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3717\n"
                       );
      return paUtilErr_;
    }
    if ((int)in_R8->hostSampleFormat != 0) {
      return PVar1;
    }
  }
  if ((in_ESI == 0) || (in_EDX == 0)) {
    if (in_ESI == 0) {
      *in_RCX = (ulong)local_38;
    }
    else {
      *in_RCX = (ulong)local_40;
    }
  }
  else {
    if (local_38 <= local_40) {
      local_40 = local_38;
    }
    *in_RCX = (ulong)local_40;
  }
  return PVar1;
}

Assistant:

static PaError PaAlsaStream_GetAvailableFrames( PaAlsaStream *self, int queryCapture, int queryPlayback, unsigned long
        *available, int *xrunOccurred )
{
    PaError result = paNoError;
    unsigned long captureFrames, playbackFrames;
    *xrunOccurred = 0;

    assert( queryCapture || queryPlayback );

    if( queryCapture )
    {
        assert( self->capture.pcm );
        PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &self->capture, &captureFrames, xrunOccurred ) );
        if( *xrunOccurred )
        {
            goto end;
        }
    }
    if( queryPlayback )
    {
        assert( self->playback.pcm );
        PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &self->playback, &playbackFrames, xrunOccurred ) );
        if( *xrunOccurred )
        {
            goto end;
        }
    }

    if( queryCapture && queryPlayback )
    {
        *available = PA_MIN( captureFrames, playbackFrames );
        /*PA_DEBUG(("capture: %lu, playback: %lu, combined: %lu\n", captureFrames, playbackFrames, *available));*/
    }
    else if( queryCapture )
    {
        *available = captureFrames;
    }
    else
    {
        *available = playbackFrames;
    }

end:
error:
    return result;
}